

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::checkUniquenessAndLinearity
               (TestLog *log,vector<unsigned_int,_std::allocator<unsigned_int>_> *values)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint *puVar4;
  reference pvVar5;
  MessageBuilder *pMVar6;
  bool bVar7;
  MessageBuilder local_368;
  uint local_1e4;
  MessageBuilder local_1e0;
  int local_5c;
  int local_58;
  int countNdx;
  int valueNdx_1;
  value_type_conflict4 local_44;
  int local_40;
  uint local_3c;
  int valueNdx;
  deUint32 maxValue;
  deUint32 minValue;
  int failedCount;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *values_local;
  TestLog *log_local;
  
  counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)values;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&minValue);
  maxValue = 0;
  valueNdx = -1;
  local_3c = 0;
  local_40 = 0;
  while( true ) {
    iVar1 = local_40;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((int)sVar2 <= iVar1) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_40);
    if (*pvVar3 != 0xffffffff) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_40);
      puVar4 = std::min<unsigned_int>((uint *)&valueNdx,pvVar3);
      valueNdx = *puVar4;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_40);
      puVar4 = std::max<unsigned_int>(&local_3c,pvVar3);
      local_3c = *puVar4;
    }
    local_40 = local_40 + 1;
  }
  local_44 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&minValue,
             (ulong)((local_3c - valueNdx) + 1),&local_44);
  local_58 = 0;
  while( true ) {
    iVar1 = local_58;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((int)sVar2 <= iVar1) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_58);
    if (*pvVar3 != 0xffffffff) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_58);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&minValue,
                          (ulong)(*pvVar3 - valueNdx));
      *pvVar5 = *pvVar5 + 1;
    }
    local_58 = local_58 + 1;
  }
  local_5c = 0;
  while( true ) {
    iVar1 = local_5c;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&minValue);
    if ((int)sVar2 <= iVar1) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&minValue,
                        (long)local_5c);
    if (*pvVar5 != 1) {
      if ((int)maxValue < 0x14) {
        tcu::TestLog::operator<<(&local_1e0,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [7])"Value ");
        local_1e4 = valueNdx + local_5c;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1e4);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [26])" is not unique. Returned ");
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&minValue,
                            (long)local_5c);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,pvVar5);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])" times.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1e0);
      }
      maxValue = maxValue + 1;
    }
    local_5c = local_5c + 1;
  }
  if (0x14 < (int)maxValue) {
    tcu::TestLog::operator<<(&local_368,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_368,(char (*) [30])"Number of values not unique: ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&maxValue);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [30])", displaying first 20 values.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_368);
  }
  bVar7 = maxValue == 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&minValue);
  return bVar7;
}

Assistant:

bool AtomicCounterTest::checkUniquenessAndLinearity (TestLog& log, const vector<deUint32>& values)
{
	vector<deUint32>	counts;
	int					failedCount	= 0;
	deUint32			minValue	= (deUint32)-1;
	deUint32			maxValue	= 0;

	DE_ASSERT(!values.empty());

	for (int valueNdx = 0; valueNdx < (int)values.size(); valueNdx++)
	{
		if (values[valueNdx] != (deUint32)-1)
		{
			minValue = std::min(minValue, values[valueNdx]);
			maxValue = std::max(maxValue, values[valueNdx]);
		}
	}

	counts.resize(maxValue - minValue + 1, 0);

	for (int valueNdx = 0; valueNdx < (int)values.size(); valueNdx++)
	{
		if (values[valueNdx] != (deUint32)-1)
			counts[values[valueNdx] - minValue]++;
	}

	for (int countNdx = 0; countNdx < (int)counts.size(); countNdx++)
	{
		if (counts[countNdx] != 1)
		{
			if (failedCount < 20)
				log << TestLog::Message << "Value " << (minValue + countNdx) << " is not unique. Returned " << counts[countNdx] << " times." << TestLog::EndMessage;

			failedCount++;
		}
	}

	if (failedCount > 20)
		log << TestLog::Message << "Number of values not unique: " << failedCount << ", displaying first 20 values." << TestLog::EndMessage;

	return failedCount == 0;
}